

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O2

int __thiscall
cmCPackGenerator::InstallCMakeProject
          (cmCPackGenerator *this,bool setDestDir,string *installDirectory,
          string *baseTempInstallDirectory,mode_t *default_dir_mode,string *component,
          bool componentInstall,string *installSubDirectory,string *buildConfig,
          string *absoluteDestFiles)

{
  cmCPackLog *pcVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  mapped_type *pmVar8;
  uint uVar9;
  string *this_00;
  pointer remote;
  string installComponentLowerCase;
  string dir;
  string tempInstallDirectory;
  string localFileName;
  ostringstream cmCPackLog_msg_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesAfter;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filesBefore;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_11f8;
  string findExpr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string installFile;
  _Any_data local_1198;
  code *local_1188;
  code *local_1180;
  cmMakefile mf;
  cmake cm;
  cmGlobalGenerator gg;
  
  std::__cxx11::string::string((string *)&tempInstallDirectory,(string *)baseTempInstallDirectory);
  std::operator+(&installFile,installDirectory,"/cmake_install.cmake");
  if (componentInstall) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&mf);
    poVar5 = std::operator<<((ostream *)&mf,"-   Install component: ");
    poVar5 = std::operator<<(poVar5,(string *)component);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,1,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2ac,(char *)gg._vptr_cmGlobalGenerator);
    std::__cxx11::string::~string((string *)&gg);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&mf);
  }
  cmake::cmake(&cm,RoleScript,CPack);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  std::__cxx11::string::string<std::allocator<char>>((string *)&mf,"",(allocator<char> *)&gg);
  cmake::SetHomeOutputDirectory(&cm,(string *)&mf);
  std::__cxx11::string::~string((string *)&mf);
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur =
       (_Elt_pointer)cm.CurrentSnapshot.Position.Position;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)cm.CurrentSnapshot.State;
  mf.FindPackageRootPathStack.
  super__Deque_base<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = (size_t)cm.CurrentSnapshot.Position.Tree;
  cmStateSnapshot::SetDefaultDefinitions((cmStateSnapshot *)&mf);
  cmake::AddCMakePaths(&cm);
  local_1198._8_8_ = 0;
  local_1180 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx:692:26)>
               ::_M_invoke;
  local_1188 = std::
               _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx:692:26)>
               ::_M_manager;
  local_1198._M_unused._M_object = this;
  cmake::SetProgressCallback(&cm,(ProgressCallbackType *)&local_1198);
  std::_Function_base::~_Function_base((_Function_base *)&local_1198);
  cm.Trace = this->Trace;
  cm.TraceExpand = this->TraceExpand;
  cmGlobalGenerator::cmGlobalGenerator(&gg,&cm);
  _cmCPackLog_msg_1 = (pointer)cm.CurrentSnapshot.State;
  cmMakefile::cmMakefile(&mf,&gg,(cmStateSnapshot *)&cmCPackLog_msg_1);
  if (installSubDirectory->_M_string_length != 0) {
    bVar2 = std::operator!=(installSubDirectory,"/");
    if (bVar2) {
      bVar2 = std::operator!=(installSubDirectory,".");
      if (bVar2) {
        std::__cxx11::string::append((string *)&tempInstallDirectory);
      }
    }
  }
  if (componentInstall) {
    std::__cxx11::string::append((char *)&tempInstallDirectory);
    (*this->_vptr_cmCPackGenerator[7])(&cmCPackLog_msg_1,this,component);
    std::__cxx11::string::append((string *)&tempInstallDirectory);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY",
               (allocator<char> *)&dir);
    bVar2 = IsOn(this,(string *)&cmCPackLog_msg_1);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    if (bVar2) {
      std::__cxx11::string::append((char *)&tempInstallDirectory);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg_1,"CPACK_PACKAGE_FILE_NAME",(allocator<char> *)&dir);
      GetOption(this,(string *)&cmCPackLog_msg_1);
      std::__cxx11::string::append((char *)&tempInstallDirectory);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    }
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg_1,"CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
             (allocator<char> *)&dir);
  pcVar6 = GetOption(this,(string *)&cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  if ((pcVar6 != (char *)0x0) && (*pcVar6 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
               (allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,pcVar6);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  if (setDestDir) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CPACK_SET_DESTDIR",(allocator<char> *)&dir);
    pcVar6 = GetOption(this,(string *)&cmCPackLog_msg_1);
    bVar2 = cmSystemTools::IsInternallyOn(pcVar6);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg_1,"CPACK_INSTALL_PREFIX",
                 (allocator<char> *)&installComponentLowerCase);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&dir,"CPACK_PACKAGING_INSTALL_PREFIX",(allocator<char> *)&findExpr);
      pcVar6 = GetOption(this,&dir);
      SetOption(this,(string *)&cmCPackLog_msg_1,pcVar6);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    }
    dir._M_dataplus._M_p = (pointer)&dir.field_2;
    dir._M_string_length = 0;
    dir.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CPACK_INSTALL_PREFIX",
               (allocator<char> *)&installComponentLowerCase);
    pcVar6 = GetOption(this,(string *)&cmCPackLog_msg_1);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    if (pcVar6 != (char *)0x0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&cmCPackLog_msg_1,"CPACK_INSTALL_PREFIX",
                 (allocator<char> *)&installComponentLowerCase);
      GetOption(this,(string *)&cmCPackLog_msg_1);
      std::__cxx11::string::append((char *)&dir);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_INSTALL_PREFIX",
               (allocator<char> *)&installComponentLowerCase);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,dir._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,
                             "- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f2,installComponentLowerCase._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&installComponentLowerCase);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"- Setting CMAKE_INSTALL_PREFIX to \'");
    poVar5 = std::operator<<(poVar5,(string *)&dir);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x2f5,installComponentLowerCase._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&installComponentLowerCase);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    bVar2 = cmsys::SystemTools::StringStartsWith(dir._M_dataplus._M_p,"/");
    if (bVar2) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg_1,&tempInstallDirectory,&dir);
      this_00 = (string *)&cmCPackLog_msg_1;
      std::__cxx11::string::operator=((string *)&dir,(string *)this_00);
    }
    else {
      std::operator+(&installComponentLowerCase,&tempInstallDirectory,"/");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg_1,&installComponentLowerCase,&dir);
      std::__cxx11::string::operator=((string *)&dir,(string *)&cmCPackLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
      this_00 = &installComponentLowerCase;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&installComponentLowerCase,"DESTDIR=",(allocator<char> *)&findExpr);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &cmCPackLog_msg_1,&installComponentLowerCase,&tempInstallDirectory);
    cmsys::SystemTools::PutEnv((string *)&cmCPackLog_msg_1);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    std::__cxx11::string::~string((string *)&installComponentLowerCase);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"- Creating directory: \'");
    poVar5 = std::operator<<(poVar5,(string *)&dir);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x30c,installComponentLowerCase._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&installComponentLowerCase);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    bVar2 = cmsys::SystemTools::MakeDirectory(&dir,default_dir_mode);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem creating temporary directory: "
                              );
      poVar5 = std::operator<<(poVar5,(string *)&dir);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x311,installComponentLowerCase._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&installComponentLowerCase);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
      std::__cxx11::string::~string((string *)&dir);
LAB_001439d4:
      uVar9 = 0;
      goto LAB_00143d08;
    }
    std::__cxx11::string::~string((string *)&dir);
  }
  else {
    (*this->_vptr_cmCPackGenerator[0xb])();
    std::__cxx11::string::append((char *)&tempInstallDirectory);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_INSTALL_PREFIX",(allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,tempInstallDirectory._M_dataplus._M_p)
    ;
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    bVar2 = cmsys::SystemTools::MakeDirectory(&tempInstallDirectory,default_dir_mode);
    if (!bVar2) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Problem creating temporary directory: "
                              );
      poVar5 = std::operator<<(poVar5,(string *)&tempInstallDirectory);
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,0x10,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x31b,dir._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
      goto LAB_001439d4;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,
                             "- Using non-DESTDIR install... (mf.AddDefinition)");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x321,dir._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"- Setting CMAKE_INSTALL_PREFIX to \'");
    poVar5 = std::operator<<(poVar5,(string *)&tempInstallDirectory);
    poVar5 = std::operator<<(poVar5,"\'");
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x324,dir._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
  }
  if (buildConfig->_M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"BUILD_TYPE",(allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,(buildConfig->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  cmsys::SystemTools::LowerCase(&installComponentLowerCase,component);
  bVar2 = std::operator!=(&installComponentLowerCase,"all");
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_INSTALL_COMPONENT",(allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,(component->_M_dataplus)._M_p);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg_1,"CPACK_STRIP_FILES",(allocator<char> *)&dir);
  pcVar6 = GetOption(this,(string *)&cmCPackLog_msg_1);
  bVar2 = cmSystemTools::IsOff(pcVar6);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  if (!bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_INSTALL_DO_STRIP",(allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,"1");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  filesBefore.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  filesBefore.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  filesBefore.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string((string *)&findExpr,(string *)&tempInstallDirectory);
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)&cmCPackLog_msg_1);
    std::__cxx11::string::append((char *)&findExpr);
    cmsys::Glob::FindFiles((Glob *)&cmCPackLog_msg_1,&findExpr,(GlobMessages *)0x0);
    pvVar7 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&cmCPackLog_msg_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&filesBefore,pvVar7);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (filesBefore.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               filesBefore.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    cmsys::Glob::~Glob((Glob *)&cmCPackLog_msg_1);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg_1,"CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION",
             (allocator<char> *)&dir);
  bVar2 = IsOn(this,(string *)&cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  if (bVar2) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION",
               (allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,"1");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  iVar4 = (*this->_vptr_cmCPackGenerator[0x17])(this);
  if ((char)iVar4 == '\0') {
LAB_00143605:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION",
               (allocator<char> *)&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,"1");
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION",
               (allocator<char> *)&dir);
    bVar2 = IsOn(this,(string *)&cmCPackLog_msg_1);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    if (bVar2) goto LAB_00143605;
  }
  bVar2 = cmMakefile::ReadListFile(&mf,&installFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg_1,"CMAKE_ABSOLUTE_DESTINATION_FILES",(allocator<char> *)&dir)
  ;
  pcVar6 = cmMakefile::GetDefinition(&mf,(string *)&cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  if (pcVar6 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CPACK_ABSOLUTE_DESTINATION_FILES",
               (allocator<char> *)&localFileName);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dir,"CMAKE_ABSOLUTE_DESTINATION_FILES",(allocator<char> *)&local_1218);
    pcVar6 = cmMakefile::GetDefinition(&mf,&dir);
    cmMakefile::AddDefinition(&mf,(string *)&cmCPackLog_msg_1,pcVar6);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  }
  if (componentInstall) {
    cmsys::Glob::Glob((Glob *)&dir);
    dir._M_string_length = CONCAT71(dir._M_string_length._1_7_,1);
    cmsys::Glob::FindFiles((Glob *)&dir,&findExpr,(GlobMessages *)0x0);
    pvVar7 = cmsys::Glob::GetFiles_abi_cxx11_((Glob *)&dir);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&filesAfter,pvVar7);
    std::
    __sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (filesAfter.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               filesAfter.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&result,(long)filesAfter.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)filesAfter.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5,
             (allocator_type *)&cmCPackLog_msg_1);
    local_11f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 std::
                 __set_difference<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_less_iter>
                           (filesAfter.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            filesAfter.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            filesBefore.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            filesBefore.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish,
                            result.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    localFileName._M_dataplus._M_p = (pointer)&localFileName.field_2;
    localFileName._M_string_length = 0;
    localFileName.field_2._M_local_buf[0] = '\0';
    for (remote = result.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; remote != local_11f8;
        remote = remote + 1) {
      cmSystemTools::RelativePath((string *)&cmCPackLog_msg_1,&tempInstallDirectory,remote);
      std::__cxx11::string::operator=((string *)&localFileName,(string *)&cmCPackLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
      std::__cxx11::string::find_first_not_of((char)&localFileName,0x2f);
      std::__cxx11::string::substr((ulong)&cmCPackLog_msg_1,(ulong)&localFileName);
      std::__cxx11::string::operator=((string *)&localFileName,(string *)&cmCPackLog_msg_1);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCPackComponent>_>_>
               ::operator[](&this->Components,component);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(&pmVar8->Files,&localFileName);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
      poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Adding file <");
      poVar5 = std::operator<<(poVar5,(string *)&localFileName);
      poVar5 = std::operator<<(poVar5,"> to component <");
      poVar5 = std::operator<<(poVar5,(string *)component);
      poVar5 = std::operator<<(poVar5,">");
      std::endl<char,std::char_traits<char>>(poVar5);
      pcVar1 = this->Logger;
      std::__cxx11::stringbuf::str();
      cmCPackLog::Log(pcVar1,4,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                      ,0x374,local_1218._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1218);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    }
    std::__cxx11::string::~string((string *)&localFileName);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&result);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&filesAfter);
    cmsys::Glob::~Glob((Glob *)&dir);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&cmCPackLog_msg_1,"CPACK_ABSOLUTE_DESTINATION_FILES",(allocator<char> *)&dir)
  ;
  pcVar6 = cmMakefile::GetDefinition(&mf,(string *)&cmCPackLog_msg_1);
  std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
  if (pcVar6 != (char *)0x0) {
    if (absoluteDestFiles->_M_string_length != 0) {
      std::__cxx11::string::append((char *)absoluteDestFiles);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&cmCPackLog_msg_1,"CPACK_ABSOLUTE_DESTINATION_FILES",
               (allocator<char> *)&dir);
    cmMakefile::GetDefinition(&mf,(string *)&cmCPackLog_msg_1);
    std::__cxx11::string::append((char *)absoluteDestFiles);
    std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&cmCPackLog_msg_1);
    poVar5 = std::operator<<((ostream *)&cmCPackLog_msg_1,"Got some ABSOLUTE DESTINATION FILES: ");
    poVar5 = std::operator<<(poVar5,(string *)absoluteDestFiles);
    std::endl<char,std::char_traits<char>>(poVar5);
    pcVar1 = this->Logger;
    std::__cxx11::stringbuf::str();
    cmCPackLog::Log(pcVar1,4,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CPack/cmCPackGenerator.cxx"
                    ,0x37f,dir._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&dir);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&cmCPackLog_msg_1);
    if (componentInstall) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&localFileName,"CPACK_ABSOLUTE_DESTINATION_FILES",
                 (allocator<char> *)&filesAfter);
      std::operator+(&dir,&localFileName,"_");
      (*this->_vptr_cmCPackGenerator[7])(&local_1218,this,component);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &cmCPackLog_msg_1,&dir,&local_1218);
      std::__cxx11::string::~string((string *)&local_1218);
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::~string((string *)&localFileName);
      pcVar6 = GetOption(this,(string *)&cmCPackLog_msg_1);
      if (pcVar6 == (char *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dir,"CPACK_ABSOLUTE_DESTINATION_FILES",
                   (allocator<char> *)&localFileName);
        pcVar6 = cmMakefile::GetDefinition(&mf,&dir);
        SetOption(this,(string *)&cmCPackLog_msg_1,pcVar6);
      }
      else {
        pcVar6 = GetOption(this,(string *)&cmCPackLog_msg_1);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&dir,pcVar6,(allocator<char> *)&localFileName);
        std::__cxx11::string::append((char *)&dir);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&localFileName,"CPACK_ABSOLUTE_DESTINATION_FILES",
                   (allocator<char> *)&local_1218);
        cmMakefile::GetDefinition(&mf,&localFileName);
        std::__cxx11::string::append((char *)&dir);
        std::__cxx11::string::~string((string *)&localFileName);
        SetOption(this,(string *)&cmCPackLog_msg_1,dir._M_dataplus._M_p);
      }
      std::__cxx11::string::~string((string *)&dir);
      std::__cxx11::string::~string((string *)&cmCPackLog_msg_1);
    }
  }
  bVar3 = cmSystemTools::GetErrorOccuredFlag();
  uVar9 = (uint)(bVar2 && !bVar3);
  std::__cxx11::string::~string((string *)&findExpr);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&filesBefore);
  std::__cxx11::string::~string((string *)&installComponentLowerCase);
LAB_00143d08:
  cmMakefile::~cmMakefile(&mf);
  cmGlobalGenerator::~cmGlobalGenerator(&gg);
  cmake::~cmake(&cm);
  std::__cxx11::string::~string((string *)&installFile);
  std::__cxx11::string::~string((string *)&tempInstallDirectory);
  return uVar9;
}

Assistant:

int cmCPackGenerator::InstallCMakeProject(
  bool setDestDir, const std::string& installDirectory,
  const std::string& baseTempInstallDirectory, const mode_t* default_dir_mode,
  const std::string& component, bool componentInstall,
  const std::string& installSubDirectory, const std::string& buildConfig,
  std::string& absoluteDestFiles)
{
  std::string tempInstallDirectory = baseTempInstallDirectory;
  std::string installFile = installDirectory + "/cmake_install.cmake";

  if (componentInstall) {
    cmCPackLogger(cmCPackLog::LOG_OUTPUT,
                  "-   Install component: " << component << std::endl);
  }

  cmake cm(cmake::RoleScript, cmState::CPack);
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cm.GetCurrentSnapshot().SetDefaultDefinitions();
  cm.AddCMakePaths();
  cm.SetProgressCallback([this](const std::string& msg, float prog) {
    this->DisplayVerboseOutput(msg, prog);
  });
  cm.SetTrace(this->Trace);
  cm.SetTraceExpand(this->TraceExpand);
  cmGlobalGenerator gg(&cm);
  cmMakefile mf(&gg, cm.GetCurrentSnapshot());
  if (!installSubDirectory.empty() && installSubDirectory != "/" &&
      installSubDirectory != ".") {
    tempInstallDirectory += installSubDirectory;
  }
  if (componentInstall) {
    tempInstallDirectory += "/";
    // Some CPack generators would rather chose
    // the local installation directory suffix.
    // Some (e.g. RPM) use
    //  one install directory for each component **GROUP**
    // instead of the default
    //  one install directory for each component.
    tempInstallDirectory += GetComponentInstallDirNameSuffix(component);
    if (this->IsOn("CPACK_COMPONENT_INCLUDE_TOPLEVEL_DIRECTORY")) {
      tempInstallDirectory += "/";
      tempInstallDirectory += this->GetOption("CPACK_PACKAGE_FILE_NAME");
    }
  }

  const char* default_dir_inst_permissions =
    this->GetOption("CPACK_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS");
  if (default_dir_inst_permissions && *default_dir_inst_permissions) {
    mf.AddDefinition("CMAKE_INSTALL_DEFAULT_DIRECTORY_PERMISSIONS",
                     default_dir_inst_permissions);
  }

  if (!setDestDir) {
    tempInstallDirectory += this->GetPackagingInstallPrefix();
  }

  if (setDestDir) {
    // For DESTDIR based packaging, use the *project*
    // CMAKE_INSTALL_PREFIX underneath the tempInstallDirectory. The
    // value of the project's CMAKE_INSTALL_PREFIX is sent in here as
    // the value of the CPACK_INSTALL_PREFIX variable.
    //
    // If DESTDIR has been 'internally set ON' this means that
    // the underlying CPack specific generator did ask for that
    // In this case we may override CPACK_INSTALL_PREFIX with
    // CPACK_PACKAGING_INSTALL_PREFIX
    // I know this is tricky and awkward but it's the price for
    // CPACK_SET_DESTDIR backward compatibility.
    if (cmSystemTools::IsInternallyOn(this->GetOption("CPACK_SET_DESTDIR"))) {
      this->SetOption("CPACK_INSTALL_PREFIX",
                      this->GetOption("CPACK_PACKAGING_INSTALL_PREFIX"));
    }
    std::string dir;
    if (this->GetOption("CPACK_INSTALL_PREFIX")) {
      dir += this->GetOption("CPACK_INSTALL_PREFIX");
    }
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", dir.c_str());

    cmCPackLogger(
      cmCPackLog::LOG_DEBUG,
      "- Using DESTDIR + CPACK_INSTALL_PREFIX... (mf.AddDefinition)"
        << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << dir << "'"
                                                        << std::endl);

    // Make sure that DESTDIR + CPACK_INSTALL_PREFIX directory
    // exists:
    //
    if (cmSystemTools::StringStartsWith(dir.c_str(), "/")) {
      dir = tempInstallDirectory + dir;
    } else {
      dir = tempInstallDirectory + "/" + dir;
    }
    /*
     *  We must re-set DESTDIR for each component
     *  We must not add the CPACK_INSTALL_PREFIX part because
     *  it will be added using the override of CMAKE_INSTALL_PREFIX
     *  The main reason for this awkward trick is that
     *  are using DESTDIR for 2 different reasons:
     *     - Because it was asked by the CPack Generator or the user
     *       using CPACK_SET_DESTDIR
     *     - Because it was already used for component install
     *       in order to put things in subdirs...
     */
    cmSystemTools::PutEnv(std::string("DESTDIR=") + tempInstallDirectory);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Creating directory: '" << dir << "'" << std::endl);

    if (!cmsys::SystemTools::MakeDirectory(dir, default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: " << dir
                                                             << std::endl);
      return 0;
    }
  } else {
    mf.AddDefinition("CMAKE_INSTALL_PREFIX", tempInstallDirectory.c_str());

    if (!cmsys::SystemTools::MakeDirectory(tempInstallDirectory,
                                           default_dir_mode)) {
      cmCPackLogger(cmCPackLog::LOG_ERROR,
                    "Problem creating temporary directory: "
                      << tempInstallDirectory << std::endl);
      return 0;
    }

    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Using non-DESTDIR install... (mf.AddDefinition)"
                    << std::endl);
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "- Setting CMAKE_INSTALL_PREFIX to '" << tempInstallDirectory
                                                        << "'" << std::endl);
  }

  if (!buildConfig.empty()) {
    mf.AddDefinition("BUILD_TYPE", buildConfig.c_str());
  }
  std::string installComponentLowerCase = cmSystemTools::LowerCase(component);
  if (installComponentLowerCase != "all") {
    mf.AddDefinition("CMAKE_INSTALL_COMPONENT", component.c_str());
  }

  // strip on TRUE, ON, 1, one or several file names, but not on
  // FALSE, OFF, 0 and an empty string
  if (!cmSystemTools::IsOff(this->GetOption("CPACK_STRIP_FILES"))) {
    mf.AddDefinition("CMAKE_INSTALL_DO_STRIP", "1");
  }
  // Remember the list of files before installation
  // of the current component (if we are in component install)
  std::string const& InstallPrefix = tempInstallDirectory;
  std::vector<std::string> filesBefore;
  std::string findExpr = tempInstallDirectory;
  if (componentInstall) {
    cmsys::Glob glB;
    findExpr += "/*";
    glB.RecurseOn();
    glB.SetRecurseListDirs(true);
    glB.FindFiles(findExpr);
    filesBefore = glB.GetFiles();
    std::sort(filesBefore.begin(), filesBefore.end());
  }

  // If CPack was asked to warn on ABSOLUTE INSTALL DESTINATION
  // then forward request to cmake_install.cmake script
  if (this->IsOn("CPACK_WARN_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_WARN_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // If current CPack generator does support
  // ABSOLUTE INSTALL DESTINATION or CPack has been asked for
  // then ask cmake_install.cmake script to error out
  // as soon as it occurs (before installing file)
  if (!SupportsAbsoluteDestination() ||
      this->IsOn("CPACK_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION")) {
    mf.AddDefinition("CMAKE_ERROR_ON_ABSOLUTE_INSTALL_DESTINATION", "1");
  }
  // do installation
  bool res = mf.ReadListFile(installFile);
  // forward definition of CMAKE_ABSOLUTE_DESTINATION_FILES
  // to CPack (may be used by generators like CPack RPM or DEB)
  // in order to transparently handle ABSOLUTE PATH
  if (mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES")) {
    mf.AddDefinition("CPACK_ABSOLUTE_DESTINATION_FILES",
                     mf.GetDefinition("CMAKE_ABSOLUTE_DESTINATION_FILES"));
  }

  // Now rebuild the list of files after installation
  // of the current component (if we are in component install)
  if (componentInstall) {
    cmsys::Glob glA;
    glA.RecurseOn();
    glA.SetRecurseListDirs(true);
    glA.SetRecurseThroughSymlinks(false);
    glA.FindFiles(findExpr);
    std::vector<std::string> filesAfter = glA.GetFiles();
    std::sort(filesAfter.begin(), filesAfter.end());
    std::vector<std::string>::iterator diff;
    std::vector<std::string> result(filesAfter.size());
    diff = std::set_difference(filesAfter.begin(), filesAfter.end(),
                               filesBefore.begin(), filesBefore.end(),
                               result.begin());

    std::vector<std::string>::iterator fit;
    std::string localFileName;
    // Populate the File field of each component
    for (fit = result.begin(); fit != diff; ++fit) {
      localFileName = cmSystemTools::RelativePath(InstallPrefix, *fit);
      localFileName =
        localFileName.substr(localFileName.find_first_not_of('/'));
      Components[component].Files.push_back(localFileName);
      cmCPackLogger(cmCPackLog::LOG_DEBUG,
                    "Adding file <" << localFileName << "> to component <"
                                    << component << ">" << std::endl);
    }
  }

  if (nullptr != mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES")) {
    if (!absoluteDestFiles.empty()) {
      absoluteDestFiles += ";";
    }
    absoluteDestFiles += mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
    cmCPackLogger(cmCPackLog::LOG_DEBUG,
                  "Got some ABSOLUTE DESTINATION FILES: " << absoluteDestFiles
                                                          << std::endl);
    // define component specific var
    if (componentInstall) {
      std::string absoluteDestFileComponent =
        std::string("CPACK_ABSOLUTE_DESTINATION_FILES") + "_" +
        GetComponentInstallDirNameSuffix(component);
      if (nullptr != this->GetOption(absoluteDestFileComponent)) {
        std::string absoluteDestFilesListComponent =
          this->GetOption(absoluteDestFileComponent);
        absoluteDestFilesListComponent += ";";
        absoluteDestFilesListComponent +=
          mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES");
        this->SetOption(absoluteDestFileComponent,
                        absoluteDestFilesListComponent.c_str());
      } else {
        this->SetOption(absoluteDestFileComponent,
                        mf.GetDefinition("CPACK_ABSOLUTE_DESTINATION_FILES"));
      }
    }
  }
  if (cmSystemTools::GetErrorOccuredFlag() || !res) {
    return 0;
  }
  return 1;
}